

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::addSyntaxTree
          (Compilation *this,shared_ptr<slang::syntax::SyntaxTree> *tree)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  TokenKind TVar4;
  _Storage<slang::TimeScale,_true> _Var5;
  undefined4 uVar6;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  SyntaxNode *syntax;
  SyntaxNode *pSVar9;
  group_type_pointer pgVar10;
  value_type_pointer pbVar11;
  uint uVar12;
  int iVar13;
  undefined1 auVar14 [16];
  Compilation *pCVar15;
  bool bVar16;
  uint uVar17;
  NetType *hash;
  element_type *peVar18;
  SyntaxNode *pSVar19;
  uint64_t hash_00;
  logic_error *this_00;
  byte bVar20;
  ulong uVar21;
  code *pcVar22;
  value_type_pointer ppVar23;
  table_element_pointer args_1;
  NetType *pNVar24;
  undefined *puVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
  *ptVar29;
  UnconnectedDrive UVar30;
  ulong uVar31;
  long lVar32;
  uchar uVar33;
  uchar uVar36;
  uchar uVar37;
  byte bVar38;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  try_emplace_args_t local_e9;
  element_type *local_e8;
  Compilation *local_e0;
  NetType *local_d8;
  ulong local_d0;
  ulong local_c8;
  shared_ptr<slang::syntax::SyntaxTree> *local_c0;
  CompilationUnitSymbol *unit;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
  *local_b0;
  const_iterator __begin2;
  locator local_80;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  peVar18 = (tree->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_c0 = tree;
  if (peVar18 == (element_type *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument((invalid_argument *)this_00,"tree cannot be null");
    puVar25 = &std::invalid_argument::typeinfo;
    pcVar22 = std::invalid_argument::~invalid_argument;
  }
  else {
    if (this->finalized == true) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"The compilation has already been finalized");
    }
    else {
      if (peVar18->sourceMan == this->sourceManager) {
LAB_00299f22:
        pNVar24 = (NetType *)peVar18->library;
        local_e0 = this;
        if (pNVar24 == (NetType *)0x0) {
          pNVar24 = (NetType *)this->defaultLibPtr;
        }
        else {
          local_e8 = (element_type *)&this->libraryNameMap;
          __begin2.p_ = *(table_element_pointer *)&pNVar24->super_Symbol;
          __begin2.pc_ = (char_pointer)(pNVar24->super_Symbol).name._M_len;
          hash = (NetType *)
                 hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            local_e8,(basic_string_view<char,_std::char_traits<char>_> *)&__begin2);
          peVar18 = local_e8;
          uVar21 = (ulong)hash >>
                   ((byte)(this->libraryNameMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                          .arrays.groups_size_index & 0x3f);
          lVar27 = ((ulong)hash & 0xff) * 4;
          uVar33 = (&UNK_0042856c)[lVar27];
          uVar36 = (&UNK_0042856d)[lVar27];
          uVar37 = (&UNK_0042856e)[lVar27];
          bVar38 = (&UNK_0042856f)[lVar27];
          ptVar29 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                     *)(ulong)((uint)hash & 7);
          uVar26 = 0;
          uVar28 = uVar21;
          do {
            pgVar7 = (this->libraryNameMap).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                     .arrays.groups_;
            pgVar1 = pgVar7 + uVar28;
            local_48 = pgVar1->m[0].n;
            uStack_47 = pgVar1->m[1].n;
            uStack_46 = pgVar1->m[2].n;
            bStack_45 = pgVar1->m[3].n;
            uStack_44 = pgVar1->m[4].n;
            uStack_43 = pgVar1->m[5].n;
            uStack_42 = pgVar1->m[6].n;
            bStack_41 = pgVar1->m[7].n;
            uStack_40 = pgVar1->m[8].n;
            uStack_3f = pgVar1->m[9].n;
            uStack_3e = pgVar1->m[10].n;
            bStack_3d = pgVar1->m[0xb].n;
            uStack_3c = pgVar1->m[0xc].n;
            uStack_3b = pgVar1->m[0xd].n;
            uStack_3a = pgVar1->m[0xe].n;
            bVar20 = pgVar1->m[0xf].n;
            auVar34[0] = -(local_48 == uVar33);
            auVar34[1] = -(uStack_47 == uVar36);
            auVar34[2] = -(uStack_46 == uVar37);
            auVar34[3] = -(bStack_45 == bVar38);
            auVar34[4] = -(uStack_44 == uVar33);
            auVar34[5] = -(uStack_43 == uVar36);
            auVar34[6] = -(uStack_42 == uVar37);
            auVar34[7] = -(bStack_41 == bVar38);
            auVar34[8] = -(uStack_40 == uVar33);
            auVar34[9] = -(uStack_3f == uVar36);
            auVar34[10] = -(uStack_3e == uVar37);
            auVar34[0xb] = -(bStack_3d == bVar38);
            auVar34[0xc] = -(uStack_3c == uVar33);
            auVar34[0xd] = -(uStack_3b == uVar36);
            auVar34[0xe] = -(uStack_3a == uVar37);
            auVar34[0xf] = -(bVar20 == bVar38);
            uVar17 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe);
            bStack_39 = bVar20;
            if (uVar17 != 0) {
              ppVar8 = (this->libraryNameMap).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                       .arrays.elements_;
              local_d8 = hash;
              local_d0 = uVar26;
              local_c8 = uVar28;
              local_b0 = ptVar29;
              do {
                uVar12 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                ppVar23 = (value_type_pointer)(ppVar8 + uVar28 * 0xf + (ulong)uVar12);
                bVar16 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)peVar18,
                                    (basic_string_view<char,_std::char_traits<char>_> *)&__begin2,
                                    (basic_string_view<char,_std::char_traits<char>_> *)ppVar23);
                if (bVar16) goto LAB_0029a0be;
                uVar17 = uVar17 - 1 & uVar17;
              } while (uVar17 != 0);
              bVar20 = pgVar7[uVar28].m[0xf].n;
              hash = local_d8;
              uVar26 = local_d0;
              uVar28 = local_c8;
              ptVar29 = local_b0;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(long)ptVar29] & bVar20) == 0) break;
            uVar31 = (local_e0->libraryNameMap).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                     .arrays.groups_size_mask;
            lVar27 = uVar28 + uVar26;
            uVar26 = uVar26 + 1;
            uVar28 = lVar27 + 1U & uVar31;
            this = local_e0;
          } while (uVar26 <= uVar31);
          if ((local_e0->libraryNameMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
              .size_ctrl.size <
              (local_e0->libraryNameMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
              .size_ctrl.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
            ::
            unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                      ((locator *)&local_80,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                        *)local_e8,uVar21,(size_t)hash,(try_emplace_args_t *)&unit,
                       (basic_string_view<char,_std::char_traits<char>_> *)&__begin2);
            ppVar23 = local_80.p;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                      ((locator *)&local_80,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                        *)local_e8,(size_t)hash,(try_emplace_args_t *)&unit,
                       (basic_string_view<char,_std::char_traits<char>_> *)&__begin2);
            ppVar23 = local_80.p;
          }
LAB_0029a0be:
          (ppVar23->second).defaultNetType = pNVar24;
          peVar18 = (local_c0->
                    super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
        }
        pCVar15 = local_e0;
        syntax = peVar18->rootNode;
        pSVar9 = syntax;
        do {
          pSVar19 = pSVar9;
          pSVar9 = pSVar19->parent;
        } while (pSVar9 != (SyntaxNode *)0x0);
        unit = BumpAllocator::
               emplace<slang::ast::CompilationUnitSymbol,slang::ast::Compilation&,slang::SourceLibrary_const&>
                         (&local_e0->super_BumpAllocator,local_e0,(SourceLibrary *)pNVar24);
        (unit->super_Symbol).originatingSyntax = pSVar19;
        Scope::addMember(&((pCVar15->root)._M_t.
                           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                          super_Scope,&unit->super_Symbol);
        std::
        vector<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
        ::push_back(&pCVar15->compilationUnits,&unit);
        __begin2 = (const_iterator)
                   boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                   ::begin((table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                            *)(((local_c0->
                                super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->metadata)._M_t.
                              super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
                              .super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>);
        local_b0 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                    *)&pCVar15->syntaxMetadata;
        args_1 = __begin2.p_;
        do {
          pCVar15 = local_e0;
          if (args_1 == (table_element_pointer)0x0) {
            __begin2 = (const_iterator)
                       boost::unordered::detail::foa::
                       table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::begin((table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)((long)(((local_c0->
                                           super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr)->metadata)._M_t.
                                         super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
                                         .
                                         super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>
                                  + 0x30));
            local_e8 = (element_type *)&local_e0->globalInstantiations;
            pNVar24 = (NetType *)__begin2.p_;
            do {
              pCVar15 = local_e0;
              peVar18 = local_e8;
              if (pNVar24 == (NetType *)0x0) {
                if (syntax->kind == CompilationUnit) {
                  pSVar9 = syntax[2].previewNode;
                  lVar27 = *(long *)(syntax + 3);
                  for (lVar32 = 0; lVar27 << 3 != lVar32; lVar32 = lVar32 + 8) {
                    CompilationUnitSymbol::addMembers
                              (unit,*(SyntaxNode **)((long)&pSVar9->kind + lVar32));
                  }
                }
                else if (syntax->kind == LibraryMap) {
                  pSVar9 = syntax[2].previewNode;
                  lVar27 = *(long *)(syntax + 3);
                  for (lVar32 = 0; lVar27 << 3 != lVar32; lVar32 = lVar32 + 8) {
                    CompilationUnitSymbol::addMembers
                              (unit,*(SyntaxNode **)((long)&pSVar9->kind + lVar32));
                  }
                }
                else {
                  CompilationUnitSymbol::addMembers(unit,syntax);
                }
                std::
                vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
                ::emplace_back<std::shared_ptr<slang::syntax::SyntaxTree>>
                          ((vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
                            *)&pCVar15->syntaxTrees,local_c0);
                std::_Optional_payload_base<slang::Diagnostics>::_M_reset
                          ((_Optional_payload_base<slang::Diagnostics> *)
                           &pCVar15->cachedParseDiagnostics);
                return;
              }
              hash_00 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                        operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                    *)local_e8,
                                   (basic_string_view<char,_std::char_traits<char>_> *)pNVar24);
              uVar21 = hash_00 >>
                       ((byte)*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                               peVar18 & 0x3f);
              lVar27 = (hash_00 & 0xff) * 4;
              uVar33 = (&UNK_0042856c)[lVar27];
              uVar36 = (&UNK_0042856d)[lVar27];
              uVar37 = (&UNK_0042856e)[lVar27];
              bVar38 = (&UNK_0042856f)[lVar27];
              uVar26 = 0;
              uVar28 = uVar21;
              do {
                pgVar10 = (local_e0->globalInstantiations).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                          .arrays.groups_;
                pgVar3 = pgVar10 + uVar28;
                local_68 = pgVar3->m[0].n;
                uStack_67 = pgVar3->m[1].n;
                uStack_66 = pgVar3->m[2].n;
                bStack_65 = pgVar3->m[3].n;
                uStack_64 = pgVar3->m[4].n;
                uStack_63 = pgVar3->m[5].n;
                uStack_62 = pgVar3->m[6].n;
                bStack_61 = pgVar3->m[7].n;
                uStack_60 = pgVar3->m[8].n;
                uStack_5f = pgVar3->m[9].n;
                uStack_5e = pgVar3->m[10].n;
                bStack_5d = pgVar3->m[0xb].n;
                uStack_5c = pgVar3->m[0xc].n;
                uStack_5b = pgVar3->m[0xd].n;
                uStack_5a = pgVar3->m[0xe].n;
                bVar20 = pgVar3->m[0xf].n;
                auVar35[0] = -(local_68 == uVar33);
                auVar35[1] = -(uStack_67 == uVar36);
                auVar35[2] = -(uStack_66 == uVar37);
                auVar35[3] = -(bStack_65 == bVar38);
                auVar35[4] = -(uStack_64 == uVar33);
                auVar35[5] = -(uStack_63 == uVar36);
                auVar35[6] = -(uStack_62 == uVar37);
                auVar35[7] = -(bStack_61 == bVar38);
                auVar35[8] = -(uStack_60 == uVar33);
                auVar35[9] = -(uStack_5f == uVar36);
                auVar35[10] = -(uStack_5e == uVar37);
                auVar35[0xb] = -(bStack_5d == bVar38);
                auVar35[0xc] = -(uStack_5c == uVar33);
                auVar35[0xd] = -(uStack_5b == uVar36);
                auVar35[0xe] = -(uStack_5a == uVar37);
                auVar35[0xf] = -(bVar20 == bVar38);
                uVar17 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
                bStack_59 = bVar20;
                if (uVar17 != 0) {
                  pbVar11 = (local_e0->globalInstantiations).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                            .arrays.elements_;
                  local_d8 = pNVar24;
                  local_d0 = uVar26;
                  local_c8 = uVar28;
                  do {
                    iVar13 = 0;
                    if (uVar17 != 0) {
                      for (; (uVar17 >> iVar13 & 1) == 0; iVar13 = iVar13 + 1) {
                      }
                    }
                    bVar16 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                             operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                         *)local_e8,
                                        (basic_string_view<char,_std::char_traits<char>_> *)local_d8
                                        ,(basic_string_view<char,_std::char_traits<char>_> *)
                                         ((long)&pbVar11[uVar28 * 0xf]._M_len +
                                         (ulong)(uint)(iVar13 << 4)));
                    if (bVar16) goto LAB_0029a4c8;
                    uVar17 = uVar17 - 1 & uVar17;
                  } while (uVar17 != 0);
                  bVar20 = pgVar10[uVar28].m[0xf].n;
                  pNVar24 = local_d8;
                  uVar26 = local_d0;
                  uVar28 = local_c8;
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)hash_00 & 7] & bVar20) == 0)
                break;
                uVar31 = (local_e0->globalInstantiations).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_size_mask;
                lVar27 = uVar28 + uVar26;
                uVar26 = uVar26 + 1;
                uVar28 = lVar27 + 1U & uVar31;
              } while (uVar26 <= uVar31);
              if ((local_e0->globalInstantiations).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                  .size_ctrl.size <
                  (local_e0->globalInstantiations).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                  .size_ctrl.ml) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>const&>
                          ((locator *)&local_80,
                           (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                            *)local_e8,uVar21,hash_00,
                           (basic_string_view<char,_std::char_traits<char>_> *)pNVar24);
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::
                unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>const&>
                          ((locator *)&local_80,
                           (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                            *)local_e8,hash_00,
                           (basic_string_view<char,_std::char_traits<char>_> *)pNVar24);
              }
LAB_0029a4c8:
              boost::unordered::detail::foa::
              table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
              ::increment((table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                           *)&__begin2);
              pNVar24 = (NetType *)__begin2.p_;
            } while( true );
          }
          local_e8 = (local_c0->
                     super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
          local_d8 = getNetType(local_e0,(args_1->second).defaultNetType);
          _Var5 = (args_1->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::TimeScale>._M_payload;
          TVar4 = (args_1->second).unconnectedDrive;
          UVar30 = (uint)(TVar4 == Pull1Keyword) * 2;
          if (TVar4 == Pull0Keyword) {
            UVar30 = Pull0;
          }
          auVar14._8_8_ = 0;
          auVar14._0_8_ = args_1->first;
          uVar21 = SUB168(auVar14 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar14 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar28 = uVar21 >> ((byte)(pCVar15->syntaxMetadata).table_.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                                    .arrays.groups_size_index & 0x3f);
          local_d0 = CONCAT71(local_d0._1_7_,
                              (args_1->second).timeScale.
                              super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                              super__Optional_payload_base<slang::TimeScale>._M_engaged);
          bVar16 = (args_1->second).cellDefine;
          uVar6 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar21 & 0xff];
          ppVar23 = (pCVar15->syntaxMetadata).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                    .arrays.elements_;
          local_c8 = (pCVar15->syntaxMetadata).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                     .arrays.groups_size_mask;
          uVar31 = 0;
          uVar26 = uVar28;
          do {
            pgVar2 = (pCVar15->syntaxMetadata).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                     .arrays.groups_ + uVar26;
            local_58 = pgVar2->m[0].n;
            uStack_57 = pgVar2->m[1].n;
            uStack_56 = pgVar2->m[2].n;
            bStack_55 = pgVar2->m[3].n;
            uStack_54 = pgVar2->m[4].n;
            uStack_53 = pgVar2->m[5].n;
            uStack_52 = pgVar2->m[6].n;
            bStack_51 = pgVar2->m[7].n;
            uStack_50 = pgVar2->m[8].n;
            uStack_4f = pgVar2->m[9].n;
            uStack_4e = pgVar2->m[10].n;
            bStack_4d = pgVar2->m[0xb].n;
            uStack_4c = pgVar2->m[0xc].n;
            uStack_4b = pgVar2->m[0xd].n;
            uStack_4a = pgVar2->m[0xe].n;
            bStack_49 = pgVar2->m[0xf].n;
            uVar33 = (uchar)uVar6;
            auVar39[0] = -(local_58 == uVar33);
            uVar36 = (uchar)((uint)uVar6 >> 8);
            auVar39[1] = -(uStack_57 == uVar36);
            uVar37 = (uchar)((uint)uVar6 >> 0x10);
            auVar39[2] = -(uStack_56 == uVar37);
            bVar38 = (byte)((uint)uVar6 >> 0x18);
            auVar39[3] = -(bStack_55 == bVar38);
            auVar39[4] = -(uStack_54 == uVar33);
            auVar39[5] = -(uStack_53 == uVar36);
            auVar39[6] = -(uStack_52 == uVar37);
            auVar39[7] = -(bStack_51 == bVar38);
            auVar39[8] = -(uStack_50 == uVar33);
            auVar39[9] = -(uStack_4f == uVar36);
            auVar39[10] = -(uStack_4e == uVar37);
            auVar39[0xb] = -(bStack_4d == bVar38);
            auVar39[0xc] = -(uStack_4c == uVar33);
            auVar39[0xd] = -(uStack_4b == uVar36);
            auVar39[0xe] = -(uStack_4a == uVar37);
            auVar39[0xf] = -(bStack_49 == bVar38);
            for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe); uVar17 != 0
                ; uVar17 = uVar17 - 1 & uVar17) {
              uVar12 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                }
              }
              if (args_1->first == ppVar23[uVar26 * 0xf + (ulong)uVar12].first) {
                ppVar23 = ppVar23 + uVar26 * 0xf + (ulong)uVar12;
                goto LAB_0029a2d5;
              }
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & bStack_49) == 0)
            break;
            lVar27 = uVar26 + uVar31;
            uVar31 = uVar31 + 1;
            uVar26 = lVar27 + 1U & local_c8;
          } while (uVar31 <= local_c8);
          if ((local_e0->syntaxMetadata).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
              .size_ctrl.size <
              (local_e0->syntaxMetadata).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
              .size_ctrl.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
            ::
            unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*const&>
                      (&local_80,local_b0,uVar28,uVar21,&local_e9,&args_1->first);
            ppVar23 = local_80.p;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*const&>
                      (&local_80,local_b0,uVar21,&local_e9,&args_1->first);
            ppVar23 = local_80.p;
          }
LAB_0029a2d5:
          (ppVar23->second).tree = local_e8;
          (ppVar23->second).defaultNetType = local_d8;
          (ppVar23->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_payload = _Var5;
          (ppVar23->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_engaged = local_d0._0_1_;
          *(undefined2 *)&(ppVar23->second).field_0x15 = local_80.pg._0_2_;
          (ppVar23->second).field_0x17 = local_80.pg._2_1_;
          (ppVar23->second).unconnectedDrive = UVar30;
          (ppVar23->second).cellDefine = bVar16;
          boost::unordered::detail::foa::
          table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
          ::increment(&__begin2);
          args_1 = __begin2.p_;
        } while( true );
      }
      if (this->sourceManager == (SourceManager *)0x0) {
        this->sourceManager = peVar18->sourceMan;
        goto LAB_00299f22;
      }
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,
                 "All syntax trees added to the compilation must use the same source manager");
    }
    puVar25 = &std::logic_error::typeinfo;
    pcVar22 = std::logic_error::~logic_error;
  }
  __cxa_throw(this_00,puVar25,pcVar22);
}

Assistant:

void Compilation::addSyntaxTree(std::shared_ptr<SyntaxTree> tree) {
    SLANG_ASSERT(!isFrozen());

    if (!tree)
        SLANG_THROW(std::invalid_argument("tree cannot be null"));

    if (finalized)
        SLANG_THROW(std::logic_error("The compilation has already been finalized"));

    if (&tree->sourceManager() != sourceManager) {
        if (!sourceManager)
            sourceManager = &tree->sourceManager();
        else {
            SLANG_THROW(std::logic_error(
                "All syntax trees added to the compilation must use the same source manager"));
        }
    }

    auto lib = tree->getSourceLibrary();
    if (lib) {
        auto& entry = libraryNameMap[lib->name];
        SLANG_ASSERT(entry == nullptr || entry == lib);
        entry = lib;
    }
    else {
        lib = defaultLibPtr;
    }

    const SyntaxNode& node = tree->root();
    const SyntaxNode* topNode = &node;
    while (topNode->parent)
        topNode = topNode->parent;

    auto unit = emplace<CompilationUnitSymbol>(*this, *lib);
    unit->setSyntax(*topNode);
    root->addMember(*unit);
    compilationUnits.push_back(unit);

    for (auto& [n, meta] : tree->getMetadata().nodeMap) {
        SyntaxMetadata result;
        result.tree = tree.get();
        result.defaultNetType = &getNetType(meta.defaultNetType);
        result.timeScale = meta.timeScale;

        switch (meta.unconnectedDrive) {
            case TokenKind::Pull0Keyword:
                result.unconnectedDrive = UnconnectedDrive::Pull0;
                break;
            case TokenKind::Pull1Keyword:
                result.unconnectedDrive = UnconnectedDrive::Pull1;
                break;
            default:
                result.unconnectedDrive = UnconnectedDrive::None;
                break;
        }

        result.cellDefine = meta.cellDefine;

        syntaxMetadata[n] = result;
    }

    for (auto& name : tree->getMetadata().globalInstances)
        globalInstantiations.emplace(name);

    if (node.kind == SyntaxKind::CompilationUnit) {
        for (auto member : node.as<CompilationUnitSyntax>().members)
            unit->addMembers(*member);
    }
    else if (node.kind == SyntaxKind::LibraryMap) {
        for (auto member : node.as<LibraryMapSyntax>().members)
            unit->addMembers(*member);
    }
    else {
        unit->addMembers(node);
    }

    syntaxTrees.emplace_back(std::move(tree));
    cachedParseDiagnostics.reset();
}